

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O1

deUint32 vkt::image::getDimensions(ImageType imageType)

{
  deUint32 dVar1;
  
  dVar1 = 0;
  if (imageType < IMAGE_TYPE_LAST) {
    dVar1 = *(deUint32 *)(&DAT_00b684d8 + (ulong)imageType * 4);
  }
  return dVar1;
}

Assistant:

deUint32 getDimensions (const ImageType imageType)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return 1u;

		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_2D:
			return 2u;

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
		case IMAGE_TYPE_3D:
			return 3u;

		default:
			DE_FATAL("Unknown image type");
			return 0u;
	}
}